

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_integer_multiply(sysbvm_context_t *context,sysbvm_tuple_t left,sysbvm_tuple_t right)

{
  uint uVar1;
  sysbvm_tuple_t sVar2;
  sysbvm_object_tuple_t *integer;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  anon_union_8_2_52f2f10a_for_sysbvm_object_tuple_s_1 *paVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  size_t i;
  long lVar13;
  ulong uVar14;
  sysbvm_decoded_integer_t decodedRightInteger;
  sysbvm_decoded_integer_t decodedLeftInteger;
  
  if ((right & 0xf) != 0 && (left & 0xf) != 0) {
    sVar2 = sysbvm_tuple_integer_encodeInt64(context,((long)right >> 4) * ((long)left >> 4));
    return sVar2;
  }
  decodedLeftInteger.words = (uint32_t *)0x0;
  decodedLeftInteger.inlineWordBuffer[0] = 0;
  decodedLeftInteger.inlineWordBuffer[1] = 0;
  decodedLeftInteger.isNegative = false;
  decodedLeftInteger._1_7_ = 0;
  decodedLeftInteger.wordCount = 0;
  decodedRightInteger.words = (uint32_t *)0x0;
  decodedRightInteger.inlineWordBuffer[0] = 0;
  decodedRightInteger.inlineWordBuffer[1] = 0;
  decodedRightInteger.isNegative = false;
  decodedRightInteger._1_7_ = 0;
  decodedRightInteger.wordCount = 0;
  sysbvm_integer_decodeLargeOrImmediate(context,&decodedLeftInteger,left);
  sysbvm_integer_decodeLargeOrImmediate(context,&decodedRightInteger,right);
  uVar3 = decodedRightInteger.wordCount + decodedLeftInteger.wordCount + 1;
  lVar13 = decodedLeftInteger.wordCount + decodedRightInteger.wordCount;
  integer = sysbvm_context_allocateByteTuple
                      (context,(&(context->roots).largePositiveIntegerType)
                               [decodedLeftInteger.isNegative != decodedRightInteger.isNegative],
                       lVar13 * 4 + 4);
  paVar7 = &integer->field_1;
  for (lVar8 = -1; lVar13 != lVar8; lVar8 = lVar8 + 1) {
    *(undefined4 *)((long)&integer->field_1 + lVar8 * 4 + 4) = 0;
  }
  sVar6 = decodedRightInteger.wordCount;
  if (uVar3 <= decodedRightInteger.wordCount) {
    sVar6 = uVar3;
  }
  uVar9 = 0;
  uVar10 = uVar3;
  while( true ) {
    uVar11 = uVar10;
    if (uVar10 < decodedLeftInteger.wordCount) {
      uVar11 = decodedLeftInteger.wordCount;
    }
    if (uVar9 == sVar6) break;
    uVar1 = decodedRightInteger.words[uVar9];
    uVar5 = 0;
    for (uVar14 = 0; uVar11 != uVar14; uVar14 = uVar14 + 1) {
      if (uVar14 < decodedLeftInteger.wordCount) {
        uVar4 = (ulong)decodedLeftInteger.words[uVar14];
      }
      else {
        uVar4 = 0;
      }
      if (uVar14 < uVar3 - uVar9) {
        uVar12 = (ulong)*(uint *)((long)paVar7 + uVar14 * 4);
      }
      else {
        uVar12 = 0;
      }
      uVar5 = uVar4 * uVar1 + uVar5 + uVar12;
      *(int *)((long)paVar7 + uVar14 * 4) = (int)uVar5;
      uVar5 = uVar5 >> 0x20;
    }
    uVar9 = uVar9 + 1;
    paVar7 = (anon_union_8_2_52f2f10a_for_sysbvm_object_tuple_s_1 *)((long)paVar7 + 4);
    uVar10 = uVar10 - 1;
  }
  sVar2 = sysbvm_integer_normalize(context,(sysbvm_integer_t *)integer);
  return sVar2;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_integer_multiply(sysbvm_context_t *context, sysbvm_tuple_t left, sysbvm_tuple_t right)
{
    if(sysbvm_tuple_isImmediate(left) && sysbvm_tuple_isImmediate(right))
    {
        sysbvm_stuple_t leftValue = sysbvm_tuple_integer_decodeSmall(left);
        sysbvm_stuple_t rightValue = sysbvm_tuple_integer_decodeSmall(right);

        sysbvm_stuple_t result = leftValue * rightValue;
        if(leftValue == 0 || rightValue == 0 || leftValue == result / rightValue)
            return sysbvm_tuple_integer_encodeInt64(context, leftValue * rightValue);
    }

    sysbvm_decoded_integer_t decodedLeftInteger = {0};
    sysbvm_decoded_integer_t decodedRightInteger = {0};
    sysbvm_integer_decodeLargeOrImmediate(context, &decodedLeftInteger, left);
    sysbvm_integer_decodeLargeOrImmediate(context, &decodedRightInteger, right);

    bool resultIsNegative = decodedLeftInteger.isNegative != decodedRightInteger.isNegative;
    size_t resultWordCount = decodedLeftInteger.wordCount + decodedRightInteger.wordCount + 1;
    sysbvm_integer_t *result = (sysbvm_integer_t*)sysbvm_context_allocateByteTuple(context, resultIsNegative ? context->roots.largeNegativeIntegerType : context->roots.largePositiveIntegerType, resultWordCount*4);
    sysbvm_integer_multiplyInto(decodedLeftInteger.wordCount, decodedLeftInteger.words, decodedRightInteger.wordCount, decodedRightInteger.words, resultWordCount, result->words);
    return sysbvm_integer_normalize(context, result);
}